

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTcSymProp::gen_code(CTcSymProp *this,int discard)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  
  if ((G_cs->field_0xa8 & 1) == 0) {
    CTcTokenizer::log_error
              (0x2cf5,(ulong)(uint)(this->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                                   super_CVmHashEntryCS.super_CVmHashEntry.len_,
               (this->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS
               .super_CVmHashEntry.str_);
    return;
  }
  if ((~G_cg->field_0xd0 & 0x18) == 0) {
    CTcGenTarg::write_op(G_cg,0x84);
    CTcGenTarg::write_op(G_cg,'h');
    CTcDataStream::write_prop_id
              (&G_cs->super_CTcDataStream,(uint)(this->super_CTcSymPropBase).prop_);
    pCVar3 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar3->max_sp_depth_ <= iVar2) {
      pCVar3->max_sp_depth_ = iVar1;
    }
    pCVar3->sp_depth_ = pCVar3->sp_depth_ + -1;
  }
  else {
    CTcGenTarg::write_op(G_cg,'c');
    CTcDataStream::write_prop_id
              (&G_cs->super_CTcDataStream,(uint)(this->super_CTcSymPropBase).prop_);
  }
  if (discard == 0) {
    CTcGenTarg::write_op(G_cg,0x8b);
    pCVar3 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar3->max_sp_depth_ <= iVar2) {
      pCVar3->max_sp_depth_ = iVar1;
    }
  }
  return;
}

Assistant:

void CTcSymProp::gen_code(int discard)
{
    /* 
     *   Evaluating a property is equivalent to calling the property on
     *   the "self" object with no arguments.  If there's no "self"
     *   object, an unqualified property evaluation is not possible, so
     *   log an error if this is the case.  
     */
    if (!G_cs->is_self_available())
    {
        G_tok->log_error(TCERR_PROP_NEEDS_OBJ, (int)get_sym_len(), get_sym());
        return;
    }

    if (G_cg->is_speculative())
    {
        /* push 'self', then evaluate the property in data-only mode */
        G_cg->write_op(OPC_PUSHSELF);
        G_cg->write_op(OPC_GETPROPDATA);
        G_cs->write_prop_id(prop_);

        /* we pushed the 'self' value then popped it again */
        G_cg->note_push();
        G_cg->note_pop();
    }
    else
    {
        /* generate the call to 'self' */
        G_cg->write_op(OPC_GETPROPSELF);
        G_cs->write_prop_id(prop_);
    }

    /* if they're not discarding the value, push the result */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}